

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::TestResult::Skipped(TestResult *this)

{
  bool bVar1;
  int iVar2;
  TestResult *in_RDI;
  _func_bool_TestPartResult_ptr *in_stack_00000008;
  undefined1 local_9;
  
  bVar1 = Failed(in_RDI);
  local_9 = false;
  if (!bVar1) {
    iVar2 = internal::
            CountIf<std::vector<testing::TestPartResult,std::allocator<testing::TestPartResult>>,bool(*)(testing::TestPartResult_const&)>
                      ((vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *)
                       this,in_stack_00000008);
    local_9 = 0 < iVar2;
  }
  return local_9;
}

Assistant:

bool TestResult::Skipped() const {
  return !Failed() && CountIf(test_part_results_, TestPartSkipped) > 0;
}